

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ValueFederateManager::updateTime(ValueFederateManager *this,Time newTime,Time param_2)

{
  void *pvVar1;
  Input *__args;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer pIVar4;
  InterfaceHandle handle;
  handle inpHandle;
  BlockIterator<helics::Input,_32,_helics::Input_**> fid;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> handles;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> allCall;
  InterfaceHandle local_bc;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *local_b8;
  handle local_b0;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_98;
  _Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> local_80;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> local_68;
  undefined1 local_48 [24];
  
  (this->CurrentTime).internalTimeCode = newTime.internalTimeCode;
  iVar3 = (*this->coreObject->_vptr_Core[0x34])(this->coreObject,(ulong)(uint)(this->fedID).fid);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::vector
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)&local_80,
             (vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
             CONCAT44(extraout_var,iVar3));
  if (local_80._M_impl.super__Vector_impl_data._M_start !=
      local_80._M_impl.super__Vector_impl_data._M_finish) {
    local_b8 = &this->inputs;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock(&local_b0,local_b8);
    gmlc::libguarded::
    atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
    ::load(&local_68,&this->allCallback);
    for (pIVar4 = local_80._M_impl.super__Vector_impl_data._M_start;
        pIVar4 != local_80._M_impl.super__Vector_impl_data._M_finish; pIVar4 = pIVar4 + 1) {
      local_bc.hid = pIVar4->hid;
      gmlc::containers::
      DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
      find(&local_98,local_b0.data,&local_bc);
      gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
                ((const_iterator *)local_48,&(local_b0.data)->dataStorage);
      bVar2 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                        ((BlockIterator<helics::Input,32,helics::Input**> *)&local_98,
                         (const_iterator *)local_48);
      if (bVar2) {
        pvVar1 = (local_98.ptr)->dataReference;
        *(baseType *)((long)pvVar1 + 0x28) = (this->CurrentTime).internalTimeCode;
        bVar2 = getUpdateFromCore(this,local_98.ptr);
        __args = local_98.ptr;
        if (bVar2) {
          if (*(long *)((long)pvVar1 + 0xd0) == 0) {
            if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::unlock(&local_b0);
              std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::
              operator()(&local_68,__args,
                         (TimeRepresentation<count_time<9,_long>_>)
                         (this->CurrentTime).internalTimeCode);
              gmlc::libguarded::
              shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::lock((handle *)local_48,local_b8);
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::operator=(&local_b0,
                          (lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                           *)local_48);
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_48 + 8));
            }
          }
          else {
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::unlock(&local_b0);
            std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::
            operator()((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *
                       )((long)pvVar1 + 0xc0),__args,
                       (TimeRepresentation<count_time<9,_long>_>)
                       (this->CurrentTime).internalTimeCode);
            gmlc::libguarded::
            shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::lock((handle *)local_48,local_b8);
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::operator=(&local_b0,
                        (lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                         *)local_48);
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_48 + 8));
          }
        }
      }
    }
    std::_Function_base::~_Function_base(&local_68.super__Function_base);
    std::unique_lock<std::mutex>::~unique_lock(&local_b0.m_handle_lock);
  }
  std::_Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::
  ~_Vector_base(&local_80);
  return;
}

Assistant:

void ValueFederateManager::updateTime(Time newTime, Time /*oldTime*/)
{
    CurrentTime = newTime;
    auto handles = coreObject->getValueUpdates(fedID);
    if (handles.empty()) {
        return;
    }
    // lock the data updates
    auto inpHandle = inputs.lock();
    auto allCall = allCallback.load();
    for (auto handle : handles) {
        /** find the id*/
        auto fid = inpHandle->find(handle);
        if (fid != inpHandle->end()) {  // assign the data
            auto* iData = static_cast<InputData*>(fid->dataReference);
            iData->lastUpdate = CurrentTime;

            bool updated = getUpdateFromCore(*fid);

            if (updated) {
                if (iData->callback) {
                    Input& inp = *fid;

                    inpHandle.unlock();  // need to free the lock

                    // callbacks can do all sorts of things, best not to have it locked during the
                    // callback
                    iData->callback(inp, CurrentTime);
                    inpHandle = inputs.lock();
                } else if (allCall) {
                    Input& inp = *fid;
                    inpHandle.unlock();  // need to free the lock
                    // callbacks can do all sorts of strange things, best not to have it locked
                    // during the callback
                    allCall(inp, CurrentTime);
                    inpHandle = inputs.lock();
                }
            }
        }
    }
}